

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

qint64 __thiscall QFSFileEnginePrivate::sizeFdFh(QFSFileEnginePrivate *this)

{
  bool bVar1;
  QFSFileEngine *pQVar2;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  QFSFileEngine *q;
  MetaDataFlag in_stack_ffffffffffffffbc;
  QFileSystemMetaData *in_stack_ffffffffffffffc0;
  QFSFileEnginePrivate *this_00;
  qint64 local_18;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = q_func(in_RDI);
  (*(pQVar2->super_QAbstractFileEngine)._vptr_QAbstractFileEngine[4])();
  in_RDI->field_0xc2 = in_RDI->field_0xc2 & 0xfb;
  flags.i = (Int)((ulong)&in_RDI->metaData >> 0x20);
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
            (&in_stack_ffffffffffffffc0->knownFlagsMask,in_stack_ffffffffffffffbc);
  QFileSystemMetaData::clearFlags(in_stack_ffffffffffffffc0,(MetaDataFlags)flags.i);
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
            (&in_stack_ffffffffffffffc0->knownFlagsMask,in_stack_ffffffffffffffbc);
  bVar1 = doStat(this_00,(QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
                         SUB84((ulong)lVar3 >> 0x20,0));
  if (bVar1) {
    local_18 = QFileSystemMetaData::size(&in_RDI->metaData);
  }
  else {
    local_18 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QFSFileEnginePrivate::sizeFdFh() const
{
    Q_Q(const QFSFileEngine);
    const_cast<QFSFileEngine *>(q)->flush();

    tried_stat = 0;
    metaData.clearFlags(QFileSystemMetaData::SizeAttribute);
    if (!doStat(QFileSystemMetaData::SizeAttribute))
        return 0;
    return metaData.size();
}